

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.cpp
# Opt level: O0

lua_Unsigned lua_tounsignedx(lua_State *L,int idx,int *isnum)

{
  lua_Unsigned local_58;
  luai_Cast u;
  lua_Number num;
  TValue *pTStack_40;
  lua_Unsigned res;
  TValue *o;
  TValue n;
  int *isnum_local;
  int idx_local;
  lua_State *L_local;
  
  n._8_8_ = isnum;
  pTStack_40 = index2addr(L,idx);
  if ((pTStack_40->tt_ != 3) &&
     (pTStack_40 = luaV_tonumber(pTStack_40,(TValue *)&o), pTStack_40 == (TValue *)0x0)) {
    if (n._8_8_ != 0) {
      *(undefined4 *)n._8_8_ = 0;
    }
    return 0;
  }
  local_58 = SUB84((pTStack_40->value_).n + 6755399441055744.0,0);
  if (n._8_8_ != 0) {
    *(undefined4 *)n._8_8_ = 1;
  }
  return local_58;
}

Assistant:

LUA_API lua_Unsigned lua_tounsignedx (lua_State *L, int idx, int *isnum) {
  TValue n;
  const TValue *o = index2addr(L, idx);
  if (tonumber(o, &n)) {
    lua_Unsigned res;
    lua_Number num = nvalue(o);
    lua_number2unsigned(res, num);
    if (isnum) *isnum = 1;
    return res;
  }
  else {
    if (isnum) *isnum = 0;
    return 0;
  }
}